

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.c
# Opt level: O0

char * card_print(Card *card,_Bool showDownCard)

{
  code *pcVar1;
  byte in_SIL;
  byte *in_RDI;
  
  if (cardPrintBufIndex == 0xff) {
    cardPrintBufIndex = '\0';
  }
  if (((in_RDI[3] & 1) == 0) && ((in_SIL & 1) == 0)) {
    sprintf(cardPrintBufs[cardPrintBufIndex],"BACK");
  }
  else {
    sprintf(cardPrintBufs[cardPrintBufIndex],"%3d%c",(ulong)*in_RDI,
            (ulong)(uint)(int)"cdhs"[in_RDI[1]]);
  }
  cardPrintBufIndex = cardPrintBufIndex + 1;
  if (SBORROW4((uint)cardPrintBufIndex,1)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return cardPrintBufs[(int)(cardPrintBufIndex - 1)];
}

Assistant:

char * card_print(Card * card, bool showDownCard)
{
	if(cardPrintBufIndex>=255)
		cardPrintBufIndex = 0;

	if(!card->faceUp && !showDownCard)
		sprintf(cardPrintBufs[cardPrintBufIndex], "BACK");
	else
		sprintf(cardPrintBufs[cardPrintBufIndex], "%3d%c", card->rank, SUIT_CHAR[card->suit]);

	cardPrintBufIndex++;
	return cardPrintBufs[(cardPrintBufIndex-1)];
}